

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.c
# Opt level: O0

void p_list_free(PList *list)

{
  PList *pPVar1;
  PList *next;
  PList *cur;
  PList *list_local;
  
  next = list;
  if (list != (PList *)0x0) {
    while (next != (PList *)0x0) {
      pPVar1 = next->next;
      p_free(next);
      next = pPVar1;
    }
  }
  return;
}

Assistant:

P_LIB_API void
p_list_free (PList *list)
{
	PList *cur;
	PList *next;

	if (P_UNLIKELY (list == NULL))
		return;

	for (next = cur = list; cur != NULL && next != NULL; cur = next)  {
		next = cur->next;
		p_free (cur);
	}
}